

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonArrayFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  ulong uVar3;
  JsonString local_b8;
  
  local_b8.zBuf = local_b8.zSpace;
  local_b8.nAlloc = 100;
  local_b8.nUsed = 0;
  local_b8.bStatic = '\x01';
  local_b8.bErr = '\0';
  local_b8.pCtx = ctx;
  jsonAppendChar(&local_b8,'[');
  if (0 < argc) {
    uVar3 = 0;
    do {
      if ((local_b8.nUsed != 0) && ((local_b8.zBuf[local_b8.nUsed - 1] & 0xdfU) != 0x5b)) {
        jsonAppendChar(&local_b8,',');
      }
      jsonAppendValue(&local_b8,argv[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  jsonAppendChar(&local_b8,']');
  if (local_b8.bErr == '\0') {
    sqlite3_result_text64
              (local_b8.pCtx,local_b8.zBuf,local_b8.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_b8.bStatic != '\0') | 0x11cace),'\x01');
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

static void jsonArrayFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;

  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=0; i<argc; i++){
    jsonAppendSeparator(&jx);
    jsonAppendValue(&jx, argv[i]);
  }
  jsonAppendChar(&jx, ']');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}